

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

void __thiscall Fad<long_double>::Fad(Fad<long_double> *this,int sz,longdouble *x)

{
  longdouble local_18;
  
  this->val_ = *x;
  local_18 = (longdouble)0;
  Vector<long_double>::Vector(&this->dx_,sz,&local_18);
  this->defaultVal = (longdouble)0;
  return;
}

Assistant:

Fad(const int sz, const T & x) : val_(x), dx_(sz,T(0)), defaultVal(T(0)) {;}